

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t HUF_compress1X_usingCTable_internal_bmi2
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong *puVar11;
  ulong *puVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  
  if (dstSize < 8) {
    return 0;
  }
  uVar5 = 0;
  if (dstSize == 8) {
    return 0;
  }
  puVar9 = (ulong *)((long)dst + (dstSize - 8));
  uVar10 = srcSize & 0xfffffffffffffffc;
  uVar6 = (uint)srcSize & 3;
  uVar8 = (ulong)uVar6;
  switch(uVar6) {
  case 0:
    puVar11 = (ulong *)dst;
    goto LAB_0016af14;
  case 1:
    uVar7 = 0;
    goto LAB_0016aeb3;
  case 2:
    uVar8 = 0;
    break;
  case 3:
    bVar1 = *(byte *)((long)src + uVar10 + 2);
    uVar8 = (ulong)CTable[bVar1].val;
    uVar5 = (ulong)CTable[bVar1].nbBits;
    if (CTable[bVar1].val >> (uVar5 & 0x3f) != 0) goto LAB_0016b0aa;
    if (0x3f < CTable[bVar1].nbBits) goto LAB_0016b08b;
  }
  bVar1 = *(byte *)((long)src + uVar10 + 1);
  if (CTable[bVar1].val >> ((ulong)CTable[bVar1].nbBits & 0x3f) != 0) {
LAB_0016b0aa:
    __assert_fail("(value>>nbBits) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5ea,"void BIT_addBitsFast(BIT_CStream_t *, size_t, unsigned int)");
  }
  uVar6 = (uint)CTable[bVar1].nbBits + (int)uVar5;
  uVar7 = (ulong)uVar6;
  if (uVar6 < 0x40) {
    uVar5 = (ulong)CTable[bVar1].val << (uVar5 & 0x3f) | uVar8;
LAB_0016aeb3:
    if (CTable[*(byte *)((long)src + uVar10)].val >>
        ((ulong)CTable[*(byte *)((long)src + uVar10)].nbBits & 0x3f) != 0) goto LAB_0016b0aa;
    uVar6 = (uint)CTable[*(byte *)((long)src + uVar10)].nbBits + (int)uVar7;
    if (uVar6 < 0x40) {
      if (puVar9 < dst) {
LAB_0016b0c9:
        __assert_fail("bitC->ptr <= bitC->endPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x607,"void BIT_flushBits(BIT_CStream_t *)");
      }
      uVar8 = (ulong)CTable[*(byte *)((long)src + uVar10)].val << (uVar7 & 0x3f) | uVar5;
      *(ulong *)dst = uVar8;
      puVar11 = (ulong *)((ulong)(uVar6 >> 3) + (long)dst);
      if (puVar9 < puVar11) {
        puVar11 = puVar9;
      }
      uVar5 = (ulong)(uVar6 & 7);
      uVar8 = uVar8 >> ((ulong)((byte)uVar6 & 0xf8) & 0x3f);
LAB_0016af14:
      if (uVar10 == 0) {
        puVar12 = puVar11;
        if (puVar9 < puVar11) goto LAB_0016b0c9;
      }
      else {
        do {
          bVar1 = *(byte *)((long)src + (uVar10 - 1));
          if (CTable[bVar1].val >> ((ulong)CTable[bVar1].nbBits & 0x3f) != 0) goto LAB_0016b0aa;
          uVar6 = (uint)CTable[bVar1].nbBits + (int)uVar5;
          if (0x3f < uVar6) goto LAB_0016b08b;
          bVar2 = *(byte *)((long)src + (uVar10 - 2));
          if (CTable[bVar2].val >> ((ulong)CTable[bVar2].nbBits & 0x3f) != 0) goto LAB_0016b0aa;
          uVar15 = CTable[bVar2].nbBits + uVar6;
          if (0x3f < uVar15) goto LAB_0016b08b;
          bVar3 = *(byte *)((long)src + (uVar10 - 3));
          if (CTable[bVar3].val >> ((ulong)CTable[bVar3].nbBits & 0x3f) != 0) goto LAB_0016b0aa;
          uVar14 = CTable[bVar3].nbBits + uVar15;
          if (0x3f < uVar14) goto LAB_0016b08b;
          bVar4 = *(byte *)((long)src + (uVar10 - 4));
          if (CTable[bVar4].val >> ((ulong)CTable[bVar4].nbBits & 0x3f) != 0) goto LAB_0016b0aa;
          uVar13 = CTable[bVar4].nbBits + uVar14;
          if (0x3f < uVar13) goto LAB_0016b08b;
          if (puVar9 < puVar11) goto LAB_0016b0c9;
          uVar10 = uVar10 - 4;
          uVar8 = (ulong)CTable[bVar4].val << ((ulong)uVar14 & 0x3f) |
                  (ulong)CTable[bVar3].val << ((ulong)uVar15 & 0x3f) |
                  (ulong)CTable[bVar2].val << ((ulong)uVar6 & 0x3f) |
                  (ulong)CTable[bVar1].val << uVar5 | uVar8;
          puVar12 = (ulong *)((ulong)(uVar13 >> 3) + (long)puVar11);
          if (puVar9 < puVar12) {
            puVar12 = puVar9;
          }
          *puVar11 = uVar8;
          uVar5 = (ulong)(uVar13 & 7);
          uVar8 = uVar8 >> ((ulong)((byte)uVar13 & 0xf8) & 0x3f);
          puVar11 = puVar12;
        } while (uVar10 != 0);
      }
      uVar6 = (int)uVar5 + 1;
      *puVar12 = uVar8 | 1L << uVar5;
      puVar12 = (ulong *)((ulong)(uVar6 >> 3) + (long)puVar12);
      if (puVar9 < puVar12) {
        puVar12 = puVar9;
      }
      if (puVar9 <= puVar12) {
        return 0;
      }
      return (long)puVar12 - ((long)dst + ((ulong)((uVar6 & 7) == 0) - 1));
    }
  }
LAB_0016b08b:
  __assert_fail("nbBits + bitC->bitPos < sizeof(bitC->bitContainer) * 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x5eb,"void BIT_addBitsFast(BIT_CStream_t *, size_t, unsigned int)");
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
HUF_compress1X_usingCTable_internal_body(void* dst, size_t dstSize,
                                   const void* src, size_t srcSize,
                                   const HUF_CElt* CTable)
{
    const BYTE* ip = (const BYTE*) src;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;
    size_t n;
    BIT_CStream_t bitC;

    /* init */
    if (dstSize < 8) return 0;   /* not enough space to compress */
    { size_t const initErr = BIT_initCStream(&bitC, op, oend-op);
      if (HUF_isError(initErr)) return 0; }

    n = srcSize & ~3;  /* join to mod 4 */
    switch (srcSize & 3)
    {
        case 3 : HUF_encodeSymbol(&bitC, ip[n+ 2], CTable);
                 HUF_FLUSHBITS_2(&bitC);
		 /* fall-through */
        case 2 : HUF_encodeSymbol(&bitC, ip[n+ 1], CTable);
                 HUF_FLUSHBITS_1(&bitC);
		 /* fall-through */
        case 1 : HUF_encodeSymbol(&bitC, ip[n+ 0], CTable);
                 HUF_FLUSHBITS(&bitC);
		 /* fall-through */
        case 0 : /* fall-through */
        default: break;
    }

    for (; n>0; n-=4) {  /* note : n&3==0 at this stage */
        HUF_encodeSymbol(&bitC, ip[n- 1], CTable);
        HUF_FLUSHBITS_1(&bitC);
        HUF_encodeSymbol(&bitC, ip[n- 2], CTable);
        HUF_FLUSHBITS_2(&bitC);
        HUF_encodeSymbol(&bitC, ip[n- 3], CTable);
        HUF_FLUSHBITS_1(&bitC);
        HUF_encodeSymbol(&bitC, ip[n- 4], CTable);
        HUF_FLUSHBITS(&bitC);
    }

    return BIT_closeCStream(&bitC);
}